

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cc
# Opt level: O1

int board::evaluate::score(Board *pos)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int (*paiVar10) [10];
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  
  if (((((pos->pNum[4] == 0) && (pos->pNum[10] == 0)) && (pos->pNum[5] == 0)) &&
      ((pos->pNum[0xb] == 0 && (pos->pNum[1] == 0)))) && (pos->pNum[7] == 0)) {
    if (pos->pNum[9] == 0 && pos->pNum[3] == 0) {
      if (pos->pNum[2] < 3 && pos->pNum[8] < 3) {
        return 0;
      }
    }
    else if (pos->pNum[2] == 0 && pos->pNum[8] == 0) {
      uVar7 = pos->pNum[3] - pos->pNum[9];
      uVar8 = -uVar7;
      if (0 < (int)uVar7) {
        uVar8 = uVar7;
      }
      if (uVar8 < 2) {
        return 0;
      }
    }
  }
  iVar6 = pos->material[0] - pos->material[1];
  iVar4 = iVar6 + 0x1e;
  if (pos->pNum[3] != 2) {
    iVar4 = iVar6;
  }
  iVar6 = iVar4 + -0x1e;
  if (pos->pNum[9] != 2) {
    iVar6 = iVar4;
  }
  paiVar10 = pos->pList;
  lVar11 = 1;
  do {
    paiVar10 = paiVar10 + 1;
    if (0 < (long)pos->pNum[lVar11]) {
      iVar4 = Board::PIECE_COLOR[lVar11];
      uVar9 = (ulong)iVar4;
      bVar17 = uVar9 == 0;
      iVar12 = -5;
      if (bVar17) {
        iVar12 = 5;
      }
      iVar13 = -3;
      if (bVar17) {
        iVar13 = 3;
      }
      iVar14 = -10;
      if (bVar17) {
        iVar14 = 10;
      }
      iVar15 = 10;
      if (bVar17) {
        iVar15 = -10;
      }
      lVar16 = 0;
      do {
        iVar3 = (*paiVar10)[lVar16];
        if (iVar4 == 0) {
          iVar2 = *(int *)(PIECE_SQUARE_TABLE +
                          (long)Board::SQ64[iVar3] * 4 + (long)Board::PIECE_NO_TEAM[lVar11] * 0x100)
          ;
        }
        else {
          iVar2 = -*(int *)(PIECE_SQUARE_TABLE +
                           (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE + (long)Board::SQ64[iVar3] * 4)
                           * 4 + (long)Board::PIECE_NO_TEAM[lVar11] * 0x100);
        }
        iVar6 = iVar6 + iVar2;
        if ((int)lVar11 == 0xc) {
          if (pos->material[0] < 0x44c && pos->pNum[5] == 0) {
            puVar5 = PIECE_SQUARE_TABLE_KING_END;
          }
          else {
            puVar5 = PIECE_SQUARE_TABLE_KING_OPENING;
          }
          iVar6 = iVar6 - *(int *)(puVar5 + (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE +
                                                          (long)Board::SQ64[iVar3] * 4) * 4);
        }
        else if ((int)lVar11 == 6) {
          if (pos->material[1] < 0x44c && pos->pNum[0xb] == 0) {
            puVar5 = PIECE_SQUARE_TABLE_KING_END;
          }
          else {
            puVar5 = PIECE_SQUARE_TABLE_KING_OPENING;
          }
          iVar6 = iVar6 + *(int *)(puVar5 + (long)Board::SQ64[iVar3] * 4);
        }
        else {
          iVar2 = Board::PIECE_NO_TEAM[lVar11];
          if (iVar2 == 5) {
            uVar1 = Board::FILE_MASK[Board::FILES[iVar3]];
            iVar3 = iVar13;
            if ((pos->pawns[2] == 0) && ((uVar1 & 1) != 0)) {
              iVar6 = iVar6 + iVar12;
            }
            else {
LAB_00103edc:
              if ((uVar1 & 1) == 0) {
                iVar3 = 0;
              }
              if (pos->pawns[uVar9] != 0) {
                iVar3 = 0;
              }
              iVar6 = iVar6 + iVar3;
            }
          }
          else if (iVar2 == 4) {
            uVar1 = Board::FILE_MASK[Board::FILES[iVar3]];
            iVar3 = iVar12;
            if ((pos->pawns[2] != 0) || ((uVar1 & 1) == 0)) goto LAB_00103edc;
            iVar6 = iVar6 + iVar14;
          }
          else if (iVar2 == 1) {
            iVar2 = iVar15;
            if ((Board::ISOLATED_PAWN_MASK[Board::SQ64[iVar3]] & 1) == 0) {
              iVar2 = 0;
            }
            if (pos->pawns[uVar9] != 0) {
              iVar2 = 0;
            }
            iVar6 = iVar6 + iVar2;
            if ((pos->pawns[uVar9 ^ 1] == 0) &&
               ((Board::PASSED_PAWN_MASK[uVar9][Board::SQ64[iVar3]] & 1) != 0)) {
              iVar2 = -*(int *)(PASSED_PAWN + (long)Board::RANKS[iVar3] * 4);
              if (iVar4 == 0) {
                iVar2 = *(int *)(PASSED_PAWN + (long)Board::RANKS[iVar3] * 4);
              }
              iVar6 = iVar6 + iVar2;
            }
          }
        }
        lVar16 = lVar16 + 1;
      } while (pos->pNum[lVar11] != lVar16);
    }
    lVar11 = lVar11 + 1;
    if (lVar11 == 0xd) {
      iVar4 = -iVar6;
      if (pos->side != 1) {
        iVar4 = iVar6;
      }
      return iVar4;
    }
  } while( true );
}

Assistant:

inline bool board::evaluate::materialDraw(Board& pos)
{
    if (!pos.getPieceNum(WR) && !pos.getPieceNum(BR) && !pos.getPieceNum(WQ) && !pos.getPieceNum(BQ) &&
        !pos.getPieceNum(WP) && !pos.getPieceNum(BP)) {
        if (!pos.getPieceNum(BB) && !pos.getPieceNum(WB)) {
            if (pos.getPieceNum(WN) < 3 && pos.getPieceNum(BN) < 3) {
                return true;
            }
        }
        else if (!pos.getPieceNum(WN) && !pos.getPieceNum(BN)) {
            if (abs(pos.getPieceNum(WB) - pos.getPieceNum(BB)) < 2) {
                return true;
            }
        }
    }
    return false;
}